

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_java_validator(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_type *ptVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  pointer pptVar6;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"public void validate() throws org.apache.thrift.TException {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_b0);
  poVar5 = std::operator<<(poVar5,"// check for required fields");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    if ((*pptVar6)->req_ == T_REQUIRED) {
      if (this->bean_style_ == true) {
        t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_b0);
        poVar5 = std::operator<<(poVar5,"if (!");
        generate_isset_check_abi_cxx11_(&local_50,this,*pptVar6);
        poVar5 = std::operator<<(poVar5,(string *)&local_50);
        poVar5 = std::operator<<(poVar5,") {");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_90);
        poVar5 = std::operator<<(poVar5,
                                 "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field \'"
                                );
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
        poVar5 = std::operator<<(poVar5,"\' is unset! Struct:\" + toString());");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_70);
        poVar5 = std::operator<<(poVar5,"}");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      else {
        bVar3 = type_can_be_null(this,(*pptVar6)->type_);
        poVar5 = t_generator::indent((t_generator *)this,out);
        if (bVar3) {
          poVar5 = std::operator<<(poVar5,"if (");
          poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
          poVar5 = std::operator<<(poVar5," == null) {");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          poVar5 = t_generator::indent((t_generator *)this,out);
          poVar5 = std::operator<<(poVar5,
                                   "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field \'"
                                  );
          poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
          poVar5 = std::operator<<(poVar5,"\' was not present! Struct: \" + toString());");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          poVar5 = t_generator::indent((t_generator *)this,out);
          poVar5 = std::operator<<(poVar5,"}");
        }
        else {
          poVar5 = std::operator<<(poVar5,"// alas, we cannot check \'");
          poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
          poVar5 = std::operator<<(poVar5,
                                   "\' because it\'s a primitive and you chose the non-beans generator."
                                  );
        }
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
    }
  }
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_b0);
  poVar5 = std::operator<<(poVar5,"// check for sub-struct validity");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    ptVar2 = (*pptVar6)->type_;
    iVar4 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
    if (((char)iVar4 != '\0') && (ptVar2[1].annotations_._M_t._M_impl.field_0x1 == '\0')) {
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_b0);
      poVar5 = std::operator<<(poVar5,"if (");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
      poVar5 = std::operator<<(poVar5," != null) {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b0);
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_b0);
      poVar5 = std::operator<<(poVar5,"  ");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
      poVar5 = std::operator<<(poVar5,".validate();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b0);
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_b0);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "public void validate() throws org.apache.thrift.TException {" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent() << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      if (bean_style_) {
        out << indent() << "if (!" << generate_isset_check(*f_iter) << ") {" << endl << indent()
            << "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field '"
            << (*f_iter)->get_name() << "' is unset! Struct:\" + toString());" << endl << indent()
            << "}" << endl << endl;
      } else {
        if (type_can_be_null((*f_iter)->get_type())) {
          indent(out) << "if (" << (*f_iter)->get_name() << " == null) {" << endl;
          indent(out)
              << "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field '"
              << (*f_iter)->get_name() << "' was not present! Struct: \" + toString());" << endl;
          indent(out) << "}" << endl;
        } else {
          indent(out) << "// alas, we cannot check '" << (*f_iter)->get_name()
                      << "' because it's a primitive and you chose the non-beans generator."
                      << endl;
        }
      }
    }
  }

  out << indent() << "// check for sub-struct validity" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_type* type = (*f_iter)->get_type();
    if (type->is_struct() && !((t_struct*)type)->is_union()) {
      out << indent() << "if (" << (*f_iter)->get_name() << " != null) {" << endl;
      out << indent() << "  " << (*f_iter)->get_name() << ".validate();" << endl;
      out << indent() << "}" << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;
}